

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
             *this,basic_string_view<wchar_t> value)

{
  basic_string_view<wchar_t> s;
  void *in_RCX;
  int in_EDX;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *in_RSI;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *in_RDI;
  error_handler *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *this_00;
  size_t in_stack_ffffffffffffffc0;
  error_handler local_19 [25];
  
  if (in_RSI[1].out_.super_truncating_iterator_base<wchar_t_*>.out_ == (wchar_t *)0x0) {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::write(in_RSI,in_EDX,in_RCX,(size_t)in_RCX);
  }
  else {
    in_stack_ffffffffffffffa7 =
         *(char *)((long)in_RSI[1].out_.super_truncating_iterator_base<wchar_t_*>.out_ + 0x11);
    this_00 = in_RDI;
    error_handler::error_handler(local_19);
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              (in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98);
    s.size_ = in_stack_ffffffffffffffc0;
    s.data_ = (wchar_t *)in_RSI;
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::write<wchar_t>(this_00,s,(format_specs *)in_RDI);
    in_RDI = this_00;
  }
  out((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
       *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  return &in_RDI->out_;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }